

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshParameters::Read(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  ON_SHA1_Hash *pOVar1;
  undefined8 uVar2;
  bool bVar3;
  uchar uVar4;
  uint archive_opennurbs_version;
  int i;
  uchar mesher;
  int minor_version;
  uint face_type;
  uint texture_range;
  int major_version;
  int obsolete_m_bWeld;
  double obsolete_m_combine_angle;
  ON_SubDDisplayParameters subdp;
  uint local_8c;
  byte local_85;
  int local_84;
  uint local_80;
  uint local_7c;
  int local_78;
  ON__INT32 local_74;
  double local_70;
  ON_SubDDisplayParameters local_68;
  
  memcpy(this,&DefaultMesh,0xe0);
  uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  *(undefined8 *)(this->m_geometry_settings_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_
  ;
  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  local_78 = 0;
  local_84 = 0;
  bVar3 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_78,&local_84);
  if ((bVar3) && (local_78 == 1)) {
    local_8c = (uint)this->m_bComputeCurvature;
    bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_8c);
    this->m_bComputeCurvature = local_8c != 0;
    local_8c = (uint)this->m_bSimplePlanes;
    if (bVar3) {
      bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_8c);
    }
    this->m_bSimplePlanes = local_8c != 0;
    local_8c = (uint)this->m_bRefine;
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_8c);
    }
    this->m_bRefine = local_8c != 0;
    local_8c = (uint)this->m_bJaggedSeams;
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_8c);
    }
    this->m_bJaggedSeams = local_8c != 0;
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,&local_74);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_min_edge_length);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_max_edge_length);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_aspect_ratio);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_grid_min_count);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,&this->m_grid_max_count);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_angle_radians);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_grid_amplification);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_refine_angle_radians);
    }
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadDouble(file,&local_70);
    }
    local_80 = (uint)this->m_face_type;
    if (bVar3 != false) {
      bVar3 = ON_BinaryArchive::ReadInt(file,&local_80);
    }
    pOVar1 = &this->m_geometry_settings_hash;
    if ((((bVar3 != false) && (local_80 < 0x100)) && ((int)local_80 < 3)) &&
       (local_80 != this->m_face_type)) {
      *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
      *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
      *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
      this->m_face_type = (uchar)local_80;
    }
    if ((0 < local_84 & bVar3) == 1) {
      local_7c = (uint)this->m_texture_range;
      bVar3 = ON_BinaryArchive::ReadInt(file,&local_7c);
      if (((bVar3) && (local_7c < 0x100)) &&
         ((local_7c != 0 && (((int)local_7c < 3 && (local_7c != this->m_texture_range)))))) {
        *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
             ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
        uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
        *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
        *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
        this->m_texture_range = (uchar)local_7c;
      }
      if (1 < local_84 && bVar3) {
        bVar3 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettings);
        if (bVar3) {
          bVar3 = ON_BinaryArchive::ReadDouble(file,&this->m_relative_tolerance);
        }
        if ((bVar3 != false) && (2 < local_84)) {
          local_85 = this->m_mesher;
          bVar3 = ON_BinaryArchive::ReadChar(file,&local_85);
          if ((bVar3) && ((local_85 < 2 && (this->m_mesher != local_85)))) {
            *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
                 ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
            uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
            *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
            *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
            this->m_mesher = local_85;
          }
          if (3 < local_84 && bVar3) {
            bVar3 = ON_BinaryArchive::ReadBool(file,&this->m_bCustomSettingsEnabled);
            if ((bVar3) && (4 < local_84)) {
              local_68.m_progress_reporter_interval.m_t[0] =
                   ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[0];
              local_68.m_progress_reporter_interval.m_t[1] =
                   ON_SubDDisplayParameters::Default.m_progress_reporter_interval.m_t[1];
              local_68.m_terminator = ON_SubDDisplayParameters::Default.m_terminator;
              local_68.m_progress_reporter = ON_SubDDisplayParameters::Default.m_progress_reporter;
              local_68.m_reserved6 = ON_SubDDisplayParameters::Default.m_reserved6;
              local_68.m_reserved7 = ON_SubDDisplayParameters::Default.m_reserved7;
              local_68.m_bDisplayDensityIsAbsolute =
                   ON_SubDDisplayParameters::Default.m_bDisplayDensityIsAbsolute;
              local_68.m_display_density = ON_SubDDisplayParameters::Default.m_display_density;
              local_68.m_reserved = ON_SubDDisplayParameters::Default.m_reserved;
              local_68.m_bControlNetMesh = ON_SubDDisplayParameters::Default.m_bControlNetMesh;
              local_68.m_context = ON_SubDDisplayParameters::Default.m_context;
              local_68.m_bComputeCurvature = ON_SubDDisplayParameters::Default.m_bComputeCurvature;
              local_68.m_reserved3 = ON_SubDDisplayParameters::Default.m_reserved3;
              local_68.m_reserved4 = ON_SubDDisplayParameters::Default.m_reserved4;
              local_68.m_reserved5 = ON_SubDDisplayParameters::Default.m_reserved5;
              bVar3 = ON_SubDDisplayParameters::Read(&local_68,file);
              if (bVar3) {
                uVar4 = ON_SubDDisplayParameters::EncodeAsUnsignedChar(&local_68);
                if (uVar4 != this->m_subd_mesh_parameters_as_char) {
                  *(undefined4 *)((this->m_geometry_settings_hash).m_digest + 0x10) =
                       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
                  uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
                  *(undefined8 *)pOVar1->m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
                  *(undefined8 *)((this->m_geometry_settings_hash).m_digest + 8) = uVar2;
                  this->m_subd_mesh_parameters_as_char = uVar4;
                }
                archive_opennurbs_version = ON_BinaryArchive::ArchiveOpenNURBSVersion(file);
                Internal_MeshParametersRead_UpdateSubDParameters(archive_opennurbs_version,this);
              }
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool ON_MeshParameters::Read( ON_BinaryArchive& file )
{
  *this = ON_MeshParameters::DefaultMesh;
  m_geometry_settings_hash = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    int i;

    i = m_bComputeCurvature;
    if (rc) rc = file.ReadInt(&i);
    m_bComputeCurvature = i?true:false;

    i = m_bSimplePlanes;
    if (rc) rc = file.ReadInt(&i);
    m_bSimplePlanes = i?true:false;

    i = m_bRefine;
    if (rc) rc = file.ReadInt(&i);
    m_bRefine = i?true:false;

    i = m_bJaggedSeams;
    if (rc) rc = file.ReadInt(&i);
    m_bJaggedSeams = i?true:false;

    int obsolete_m_bWeld;
    if (rc) rc = file.ReadInt(&obsolete_m_bWeld);

    if (rc) rc = file.ReadDouble(&m_tolerance);
    if (rc) rc = file.ReadDouble(&m_min_edge_length);
    if (rc) rc = file.ReadDouble(&m_max_edge_length);
    if (rc) rc = file.ReadDouble(&m_grid_aspect_ratio);
    if (rc) rc = file.ReadInt(&m_grid_min_count);
    if (rc) rc = file.ReadInt(&m_grid_max_count);
    if (rc) rc = file.ReadDouble(&m_grid_angle_radians);
    if (rc) rc = file.ReadDouble(&m_grid_amplification);
    if (rc) rc = file.ReadDouble(&m_refine_angle_radians);
    double obsolete_m_combine_angle;
    if (rc) rc = file.ReadDouble(&obsolete_m_combine_angle);
    unsigned int face_type = FaceType();
    if (rc) rc = file.ReadInt(&face_type);
    if (rc) 
      SetFaceType(face_type);

    if ( rc && minor_version >= 1 ) 
    {
      unsigned int texture_range = TextureRange();
      rc = file.ReadInt( &texture_range );
      if (rc)
        SetTextureRange(texture_range);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bCustomSettings);
        if (rc) rc = file.ReadDouble(&m_relative_tolerance);
        if ( rc && minor_version >= 3 )
        {
          unsigned char mesher = (unsigned char)Mesher();
          rc = file.ReadChar(&mesher);
          if (rc)
            SetMesher(mesher);
          if ( rc && minor_version >= 4 )
          {
            rc = file.ReadBool(&m_bCustomSettingsEnabled);
            if (rc && minor_version >= 5)
            {
              ON_SubDDisplayParameters subdp = ON_SubDDisplayParameters::Default;
              rc = subdp.Read(file);
              if (rc)
              {
                this->SetSubDDisplayParameters(subdp);
                Internal_MeshParametersRead_UpdateSubDParameters(file.ArchiveOpenNURBSVersion(), *this);
              }
            }
          }
        }
      }
    }
  }

  return rc;
}